

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

uint __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = *(int *)(this + 0x30);
  lVar5 = (long)is->src_ - (long)is->head_;
  uVar4 = 0;
  iVar6 = 4;
  pcVar2 = is->src_;
  do {
    is->src_ = pcVar2 + 1;
    cVar1 = *pcVar2;
    uVar4 = uVar4 * 0x10 + (int)cVar1;
    if ((byte)(cVar1 - 0x30U) < 10) {
      uVar4 = uVar4 - 0x30;
LAB_0011c1e3:
      bVar3 = true;
    }
    else {
      if ((byte)(cVar1 + 0xbfU) < 6) {
        uVar4 = uVar4 - 0x37;
        goto LAB_0011c1e3;
      }
      if ((byte)(cVar1 + 0x9fU) < 6) {
        uVar4 = uVar4 - 0x57;
        goto LAB_0011c1e3;
      }
      if (iVar7 != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x25d,
                      "unsigned int rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseHex4(InputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 8;
      *(long *)(this + 0x38) = lVar5;
      iVar7 = 8;
      bVar3 = false;
    }
    if (!bVar3) {
      return 0;
    }
    lVar5 = lVar5 + 1;
    iVar6 = iVar6 + -1;
    pcVar2 = pcVar2 + 1;
    if (iVar6 == 0) {
      return uVar4;
    }
  } while( true );
}

Assistant:

unsigned ParseHex4(InputStream& is) {
        unsigned codepoint = 0;
        for (int i = 0; i < 4; i++) {
            Ch c = is.Take();
            codepoint <<= 4;
            codepoint += static_cast<unsigned>(c);
            if (c >= '0' && c <= '9')
                codepoint -= '0';
            else if (c >= 'A' && c <= 'F')
                codepoint -= 'A' - 10;
            else if (c >= 'a' && c <= 'f')
                codepoint -= 'a' - 10;
            else {
                RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorStringUnicodeEscapeInvalidHex, is.Tell() - 1);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(0);
            }
        }
        return codepoint;
    }